

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall TPZManVector<TPZGraphEl_**,_10>::Shrink(TPZManVector<TPZGraphEl_**,_10> *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long in_RDI;
  int64_t i_1;
  TPZGraphEl ***newstore;
  int64_t i;
  long local_20;
  void *local_18;
  long local_10;
  
  if (*(long *)(in_RDI + 0x10) < 0xb) {
    if (*(long *)(in_RDI + 8) != in_RDI + 0x20) {
      for (local_10 = 0; local_10 < *(long *)(in_RDI + 0x10); local_10 = local_10 + 1) {
        *(undefined8 *)(in_RDI + 0x20 + local_10 * 8) =
             *(undefined8 *)(*(long *)(in_RDI + 8) + local_10 * 8);
      }
      if ((*(long *)(in_RDI + 8) != 0) && (*(void **)(in_RDI + 8) != (void *)0x0)) {
        operator_delete__(*(void **)(in_RDI + 8));
      }
      *(long *)(in_RDI + 8) = in_RDI + 0x20;
      *(undefined8 *)(in_RDI + 0x18) = 10;
    }
  }
  else if (*(long *)(in_RDI + 0x18) != *(long *)(in_RDI + 0x10)) {
    local_18 = (void *)0x0;
    if (*(long *)(in_RDI + 0x10) != 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)(in_RDI + 0x10);
      uVar2 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      local_18 = operator_new__(uVar2);
    }
    for (local_20 = 0; local_20 < *(long *)(in_RDI + 0x10); local_20 = local_20 + 1) {
      *(undefined8 *)((long)local_18 + local_20 * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 8) + local_20 * 8);
    }
    if ((*(long *)(in_RDI + 8) != 0) && (*(void **)(in_RDI + 8) != (void *)0x0)) {
      operator_delete__(*(void **)(in_RDI + 8));
    }
    *(void **)(in_RDI + 8) = local_18;
    *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RDI + 0x10);
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Shrink() {
    // Philippe : Porque NumExtAlloc <= this->fNAlloc????
    //    if(this->fNElements <= NumExtAlloc && NumExtAlloc <= this->fNAlloc) {
    if (this->fNElements <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0; i < this->fNElements; i++)
                fExtAlloc[i] = this->fStore[i];

            if (this->fStore)
                delete [] this->fStore;

            this->fStore = fExtAlloc;
            this->fNAlloc = NumExtAlloc;
        }
    } else if (this->fNAlloc != this->fNElements) { // then  fExtAlloc != this->fStore  because  NumExtAlloc != this->fNAlloc
        // Philippe : Memoria alocada externamente nao pode ser deletada
        //          if(fExtAlloc) delete[] fExtAlloc;
        T *newstore = 0;

        if (this->fNElements)
            newstore = new T[this->fNElements];

        for (int64_t i = 0; i < this->fNElements; i++)
            newstore[i] = this->fStore[i];

        if (this->fStore)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNAlloc = this->fNElements;

        // Philippe Isto eh um absurdo
        //          fExtAlloc = this->fStore;
        //          NumExtAlloc = this->fNAlloc;
    }
}